

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

void LowerConstantIntoBlock
               (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock
               ,SmallArray<unsigned_char,_32U> *result,VmValue *value)

{
  VmValueType VVar1;
  char *pcVar2;
  SynBase *location;
  uchar uVar3;
  bool rC;
  uint uVar4;
  int iVar5;
  uchar *val;
  uint uVar6;
  uchar targetReg_4;
  uchar targetReg_3;
  uchar targetReg_2;
  uchar targetReg_1;
  uchar targetReg;
  ExpressionContext *local_40;
  SmallArray<unsigned_char,_32U> *local_38;
  
  local_40 = ctx;
  local_38 = result;
  if ((value == (VmValue *)0x0) || (value->typeID != 1)) {
    __assert_fail("constant",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x138,
                  "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                 );
  }
  VVar1 = (value->type).type;
  uVar4 = (value->type).size;
  if ((VVar1 == VM_TYPE_INT) && (uVar4 == 4)) {
    targetReg = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
    val = &targetReg;
    RegVmLoweredBlock::AddInstruction
              (lowBlock,local_40,value->source,rviLoadImm,targetReg,'\0','\0',
               *(uint *)&value[1]._vptr_VmValue);
  }
  else if ((VVar1 == VM_TYPE_DOUBLE) && (uVar4 == 8)) {
    uVar3 = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
    targetReg_1 = uVar3;
    uVar4 = TryLowerConstantToMemory(lowBlock,value);
    if (uVar4 == 0) {
      __assert_fail("constantIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x148,
                    "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                   );
    }
    RegVmLoweredBlock::AddInstruction
              (lowBlock,local_40,value->source,rviLoadDouble,uVar3,'\0','\x02',uVar4 * 4 - 4);
    val = &targetReg_1;
  }
  else if ((VVar1 == VM_TYPE_LONG) && (uVar4 == 8)) {
    uVar3 = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
    targetReg_2 = uVar3;
    uVar4 = TryLowerConstantToMemory(lowBlock,value);
    if (uVar4 == 0) {
      __assert_fail("constantIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x154,
                    "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                   );
    }
    RegVmLoweredBlock::AddInstruction
              (lowBlock,local_40,value->source,rviLoadLong,uVar3,'\0','\x02',uVar4 * 4 - 4);
    val = &targetReg_2;
  }
  else {
    if (VVar1 == VM_TYPE_STRUCT) {
      if ((uVar4 & 3) != 0) {
        __assert_fail("constant->type.size % 4 == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x178,
                      "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                     );
      }
      uVar4 = TryLowerConstantToMemory(lowBlock,value);
      if (uVar4 != 0) {
        uVar4 = uVar4 * 4 - 4;
        iVar5 = 0;
        for (uVar6 = 0; uVar6 < (value->type).size >> 2; uVar6 = uVar6 + 2) {
          targetReg_4 = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
          SmallArray<unsigned_char,_32U>::push_back(local_38,&targetReg_4);
          RegVmLoweredBlock::AddInstruction
                    (lowBlock,local_40,value->source,
                     rviLoadLong - (((value->type).size >> 2) + iVar5 < 2),targetReg_4,'\0','\x02',
                     uVar4);
          iVar5 = iVar5 + -2;
          uVar4 = uVar4 + 8;
        }
        return;
      }
      __assert_fail("constantIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x17c,
                    "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                   );
    }
    if (VVar1 != VM_TYPE_POINTER) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x18b,
                    "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                   );
    }
    uVar3 = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
    pcVar2 = value[1].comment.end;
    targetReg_3 = uVar3;
    if (pcVar2 == (char *)0x0) {
      if (*(int *)&value[1]._vptr_VmValue != 0) {
        __assert_fail("constant->iValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x160,
                      "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                     );
      }
      uVar4 = TryLowerConstantToMemory(lowBlock,value);
      if (uVar4 == 0) {
        __assert_fail("constantIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x166,
                      "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                     );
      }
      RegVmLoweredBlock::AddInstruction
                (lowBlock,local_40,value->source,rviLoadLong,uVar3,'\0','\x02',uVar4 * 4 - 4);
    }
    else {
      location = value->source;
      rC = IsLocalScope(*(ScopeData **)(pcVar2 + 0x10));
      RegVmLoweredBlock::AddInstruction
                (lowBlock,local_40,location,rviGetAddr,uVar3,'\0',rC,(VmConstant *)value);
    }
    val = &targetReg_3;
  }
  SmallArray<unsigned_char,_32U>::push_back(local_38,val);
  return;
}

Assistant:

void LowerConstantIntoBlock(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, SmallArray<unsigned char, 32> &result, VmValue *value)
{
	VmConstant *constant = getType<VmConstant>(value);

	assert(constant);

	if(constant->type == VmType::Int)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		lowBlock->AddInstruction(ctx, constant->source, rviLoadImm, targetReg, 0, 0, constant->iValue);

		result.push_back(targetReg);
	}
	else if(constant->type == VmType::Double)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

		assert(constantIndex);

		lowBlock->AddInstruction(ctx, constant->source, rviLoadDouble, targetReg, 0, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));

		result.push_back(targetReg);
	}
	else if(constant->type == VmType::Long)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

		assert(constantIndex);

		lowBlock->AddInstruction(ctx, constant->source, rviLoadLong, targetReg, 0, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));

		result.push_back(targetReg);
	}
	else if(constant->type.type == VM_TYPE_POINTER)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		if(!constant->container)
		{
			assert(constant->iValue == 0);

			if(NULLC_PTR_SIZE == 8)
			{
				unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

				assert(constantIndex);

				lowBlock->AddInstruction(ctx, constant->source, rviLoadLong, targetReg, 0, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));
			}
			else
			{
				lowBlock->AddInstruction(ctx, constant->source, rviLoadImm, targetReg, 0, 0, 0u);
			}
		}
		else
		{
			lowBlock->AddInstruction(ctx, constant->source, rviGetAddr, targetReg, 0, IsLocalScope(constant->container->scope) ? rvrrFrame : rvrrGlobals, constant);
		}

		result.push_back(targetReg);
	}
	else if(constant->type.type == VM_TYPE_STRUCT)
	{
		assert(constant->type.size % 4 == 0);

		unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

		assert(constantIndex);

		for(unsigned i = 0; i < constant->type.size / 4; i += 2)
		{
			unsigned char targetReg = lowFunction->GetRegisterForConstant();
			result.push_back(targetReg);

			if(constant->type.size / 4 - i >= 2)
				lowBlock->AddInstruction(ctx, constant->source, rviLoadLong, targetReg, 0, rvrrConstants, (constantIndex - 1 + i) * sizeof(unsigned));
			else
				lowBlock->AddInstruction(ctx, constant->source, rviLoadDword, targetReg, 0, rvrrConstants, (constantIndex - 1 + i) * sizeof(unsigned));
		}
	}
	else
	{
		assert(!"unknown type");
	}
}